

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O3

int Abc_NtkMfs(Abc_Ntk_t *pNtk,Mfs_Par_t *pPars)

{
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Mfs_Man_t *p;
  Vec_Int_t *pVVar8;
  Abc_Ntk_t *pAVar9;
  Aig_Man_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  Bdc_Man_t *pBVar12;
  long lVar13;
  Vec_Vec_t *__ptr;
  ulong uVar14;
  ProgressBar *pPVar15;
  long lVar16;
  Mfs_Par_t *pPars_00;
  float fVar17;
  timespec ts;
  Bdc_Par_t Pars;
  timespec local_60;
  Abc_Ntk_t *local_50;
  long local_48;
  Bdc_Par_t local_40;
  
  local_40.fVeryVerbose = 0;
  local_40.nVarsMax = 0;
  local_40.fVerbose = 0;
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  iVar3 = pNtk->nObjCounts[7];
  iVar4 = Abc_NtkGetTotalFanins(pNtk);
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsCore.c"
                  ,0x188,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
  }
  uVar5 = Abc_NtkGetFaninMax(pNtk);
  if (pPars->fResub == 0) {
    uVar7 = 0xc;
    if ((int)uVar5 < 0xd) goto LAB_004c740f;
  }
  else {
    uVar7 = 8;
    if ((int)uVar5 < 9) goto LAB_004c740f;
  }
  uVar5 = uVar7;
  printf("Nodes with more than %d fanins will not be processed.\n",(ulong)uVar5);
LAB_004c740f:
  iVar6 = Abc_NtkToAig(pNtk);
  if (iVar6 == 0) {
    fwrite("Converting to AIGs has failed.\n",0x1f,1,_stdout);
    iVar3 = 0;
  }
  else {
    if (pNtk->ntkFunc != ABC_FUNC_AIG) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsCore.c"
                    ,0x1a2,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
    }
    p = Mfs_ManAlloc(pPars);
    p->pNtk = pNtk;
    p->nFaninMax = uVar5;
    if (pPars->fPower != 0) {
      pVVar8 = Abc_NtkPowerEstimate(pNtk,(uint)(pPars->fResub == 0));
      p->vProbs = pVVar8;
      fVar17 = Abc_NtkMfsTotalSwitching(pNtk);
      p->TotalSwitchingBeg = fVar17;
    }
    pAVar9 = (Abc_Ntk_t *)pNtk->pExcare;
    if (pAVar9 != (Abc_Ntk_t *)0x0) {
      if (pAVar9->vPis->nSize == pNtk->vCis->nSize) {
        pAVar9 = Abc_NtkStrash(pAVar9,0,0,0);
        pAVar10 = Abc_NtkToDar(pAVar9,0,0);
        p->pCare = pAVar10;
        Abc_NtkDelete(pAVar9);
        pVVar11 = Aig_ManSupportsInverse(p->pCare);
        p->vSuppsInv = pVVar11;
      }
      else {
        printf("The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n")
        ;
      }
    }
    if (p->pCare != (Aig_Man_t *)0x0) {
      printf("Performing optimization with %d external care clauses.\n",
             (ulong)(uint)p->pCare->nObjs[3]);
    }
    if (pPars->fResub == 0) {
      local_40.nVarsMax = 3;
      if (3 < (int)uVar5) {
        local_40.nVarsMax = uVar5;
      }
      local_40.fVerbose = pPars->fVerbose;
      pVVar8 = (Vec_Int_t *)calloc(1,0x10);
      p->vTruth = pVVar8;
      pBVar12 = Bdc_ManAlloc(&local_40);
      p->pManDec = pBVar12;
    }
    if ((p->pCare != (Aig_Man_t *)0x0) && (pVVar11 = pNtk->vCis, 0 < pVVar11->nSize)) {
      lVar13 = 0;
      do {
        *(long *)((long)pVVar11->pArray[lVar13] + 0x38) = lVar13;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar13 < pVVar11->nSize);
    }
    Abc_NtkLevel(pNtk);
    pPars_00 = (Mfs_Par_t *)(ulong)(uint)pPars->nGrowthLevel;
    Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
    p->nTotalNodesBeg = iVar3;
    p->nTotalEdgesBeg = iVar4;
    if (pPars->fResub == 0) {
      local_48 = lVar16;
      pPVar15 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->nObjCounts[7]);
      local_50 = pNtk;
      __ptr = Abc_NtkLevelize(pNtk);
      if (1 < __ptr->nSize) {
        lVar16 = 1;
        iVar3 = 0;
        do {
          pvVar1 = __ptr->pArray[lVar16];
          if ((p->pPars->fVeryVerbose == 0) &&
             ((pPVar15 == (ProgressBar *)0x0 || (pPVar15->nItemsNext <= iVar3)))) {
            Extra_ProgressBarUpdate_int(pPVar15,iVar3,(char *)0x0);
          }
          p->nNodesGainedLevel = 0;
          p->nTotConfLevel = 0;
          p->nTimeOutsLevel = 0;
          clock_gettime(3,&local_60);
          uVar7 = *(uint *)((long)pvVar1 + 4);
          uVar14 = (ulong)uVar7;
          if (0 < (int)uVar7) {
            lVar13 = 0;
            do {
              uVar7 = (uint)uVar14;
              pAVar2 = *(Abc_Obj_t **)(*(long *)((long)pvVar1 + 8) + lVar13 * 8);
              iVar4 = p->pPars->nDepthMax;
              if ((iVar4 != 0) && (iVar4 < (int)(*(uint *)&pAVar2->field_0x14 >> 0xc))) break;
              iVar4 = (pAVar2->vFanins).nSize;
              if (iVar4 <= (int)uVar5 && 1 < iVar4) {
                if (pPars->fResub == 0) {
                  Abc_NtkMfsNode(p,pAVar2);
                }
                else {
                  Abc_NtkMfsResub(p,pAVar2);
                }
              }
              lVar13 = lVar13 + 1;
              uVar7 = *(uint *)((long)pvVar1 + 4);
              uVar14 = (ulong)(int)uVar7;
            } while (lVar13 < (long)uVar14);
          }
          iVar3 = uVar7 + iVar3;
          lVar16 = lVar16 + 1;
        } while (lVar16 < __ptr->nSize);
      }
      Extra_ProgressBarStop(pPVar15);
      iVar3 = __ptr->nSize;
      if (0 < iVar3) {
        lVar16 = 0;
        do {
          pvVar1 = __ptr->pArray[lVar16];
          if (pvVar1 != (void *)0x0) {
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
            }
            free(pvVar1);
            iVar3 = __ptr->nSize;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar3);
      }
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
      }
      free(__ptr);
      lVar16 = local_48;
      pNtk = local_50;
    }
    else if (pPars->fPower == 0) {
      pPVar15 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      pVVar11 = pNtk->vObjs;
      if (0 < pVVar11->nSize) {
        lVar13 = 0;
        do {
          pAVar2 = (Abc_Obj_t *)pVVar11->pArray[lVar13];
          if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
            iVar3 = p->pPars->nDepthMax;
            if (((iVar3 == 0) || ((int)(*(uint *)&pAVar2->field_0x14 >> 0xc) <= iVar3)) &&
               (iVar3 = (pAVar2->vFanins).nSize, iVar3 <= (int)uVar5 && 1 < iVar3)) {
              if ((p->pPars->fVeryVerbose == 0) &&
                 ((pPVar15 == (ProgressBar *)0x0 || (pPVar15->nItemsNext <= lVar13)))) {
                Extra_ProgressBarUpdate_int(pPVar15,(int)lVar13,(char *)0x0);
              }
              if (pPars->fResub == 0) {
                Abc_NtkMfsNode(p,pAVar2);
              }
              else {
                Abc_NtkMfsResub(p,pAVar2);
              }
            }
          }
          lVar13 = lVar13 + 1;
          pVVar11 = pNtk->vObjs;
        } while (lVar13 < pVVar11->nSize);
      }
      Extra_ProgressBarStop(pPVar15);
    }
    else {
      Abc_NtkMfsPowerResub(p,pPars_00);
    }
    Abc_NtkStopReverseLevels(pNtk);
    p->nTotalNodesEnd = pNtk->nObjCounts[7];
    iVar3 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalEdgesEnd = iVar3;
    if ((p->pCare != (Aig_Man_t *)0x0) && (pVVar11 = pNtk->vCis, 0 < pVVar11->nSize)) {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)pVVar11->pArray[lVar13] + 0x38) = 0;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar13 < pVVar11->nSize);
    }
    if (pPars->fPower != 0) {
      fVar17 = Abc_NtkMfsTotalSwitching(pNtk);
      p->TotalSwitchingEnd = fVar17;
    }
    iVar3 = clock_gettime(3,&local_60);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeTotal = lVar13 + lVar16;
    Mfs_ManStop(p);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Abc_NtkMfs( Abc_Ntk_t * pNtk, Mfs_Par_t * pPars )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );

    Bdc_Par_t Pars = {0}, * pDecPars = &Pars;
    ProgressBar * pProgress;
    Mfs_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    Vec_Ptr_t * vNodes;
    int i, k, nNodes, nFaninMax;
    abctime clk = Abc_Clock(), clk2;
    int nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    int nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);

    assert( Abc_NtkIsLogic(pNtk) );
    nFaninMax = Abc_NtkGetFaninMax(pNtk);
    if ( pPars->fResub )
    {
        if ( nFaninMax > 8 )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", 8 );
            nFaninMax = 8;
        }
    }
    else
    {
        if ( nFaninMax > MFS_FANIN_MAX )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", MFS_FANIN_MAX );
            nFaninMax = MFS_FANIN_MAX;
        }
    }
    // perform the network sweep
//    Abc_NtkSweep( pNtk, 0 );
    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIGs has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // start the manager
    p = Mfs_ManAlloc( pPars );
    p->pNtk = pNtk;
    p->nFaninMax = nFaninMax;

    // precomputer power-aware metrics
    if ( pPars->fPower )
    {
        extern Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne );
        if ( pPars->fResub )
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
        else
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 1 );
#if 0
        printf( "Total switching before = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
        p->TotalSwitchingBeg = Abc_NtkMfsTotalSwitching(pNtk);
#endif
    }

    if ( pNtk->pExcare )
    {
        Abc_Ntk_t * pTemp;
        if ( Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare) != Abc_NtkCiNum(pNtk) )
            printf( "The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n",
                Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare), Abc_NtkCiNum(pNtk) );
        else
        {
            pTemp = Abc_NtkStrash( (Abc_Ntk_t *)pNtk->pExcare, 0, 0, 0 );
            p->pCare = Abc_NtkToDar( pTemp, 0, 0 );
            Abc_NtkDelete( pTemp );
            p->vSuppsInv = Aig_ManSupportsInverse( p->pCare );
        }
    }
    if ( p->pCare != NULL )
        printf( "Performing optimization with %d external care clauses.\n", Aig_ManCoNum(p->pCare) );
    // prepare the BDC manager
    if ( !pPars->fResub )
    {
        pDecPars->nVarsMax = (nFaninMax < 3) ? 3 : nFaninMax;
        pDecPars->fVerbose = pPars->fVerbose;
        p->vTruth = Vec_IntAlloc( 0 );
        p->pManDec = Bdc_ManAlloc( pDecPars );
    }

    // label the register outputs
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = (void *)(ABC_PTRUINT_T)i;
    }

    // compute levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // compute don't-cares for each node
    nNodes = 0;
    p->nTotalNodesBeg = nTotalNodesBeg;
    p->nTotalEdgesBeg = nTotalEdgesBeg;
    if ( pPars->fResub )
    {
#if 0
        printf( "TotalSwitching (%7.2f --> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
        if (pPars->fPower)
        {
            Abc_NtkMfsPowerResub( p, pPars);
        } else
        {
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                continue;
            if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                continue;
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            if ( pPars->fResub )
                Abc_NtkMfsResub( p, pObj );
            else
                Abc_NtkMfsNode( p, pObj );
        }
        Extra_ProgressBarStop( pProgress );
#if 0
        printf( " %7.2f )\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
    } else
    {
#if 0
        printf( "Total switching before  = %7.2f,  ----> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
        vLevels = Abc_NtkLevelize( pNtk );
        Vec_VecForEachLevelStart( vLevels, vNodes, k, 1 )
        {
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, nNodes, NULL );
            p->nNodesGainedLevel = 0;
            p->nTotConfLevel = 0;
            p->nTimeOutsLevel = 0;
            clk2 = Abc_Clock();
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                    break;
                if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                    continue;
                if ( pPars->fResub )
                    Abc_NtkMfsResub( p, pObj );
                else
                    Abc_NtkMfsNode( p, pObj );
            }
            nNodes += Vec_PtrSize(vNodes);
            if ( pPars->fVerbose )
            {
                /*
            printf( "Lev = %2d. Node = %5d. Ave gain = %5.2f. Ave conf = %5.2f. T/o = %6.2f %%  ",
                k, Vec_PtrSize(vNodes),
                1.0*p->nNodesGainedLevel/Vec_PtrSize(vNodes),
                1.0*p->nTotConfLevel/Vec_PtrSize(vNodes),
                100.0*p->nTimeOutsLevel/Vec_PtrSize(vNodes) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
            */
            }
        }
        Extra_ProgressBarStop( pProgress );
        Vec_VecFree( vLevels );
#if 0
        printf( " %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
    Abc_NtkStopReverseLevels( pNtk );

    // perform the sweeping
    if ( !pPars->fResub )
    {
        extern void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose );
//        Abc_NtkSweep( pNtk, 0 );
//        Abc_NtkBidecResyn( pNtk, 0 );
    }

    p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);

    // undo labesl
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = NULL;
    }

    if ( pPars->fPower )
    {
#if 1
        p->TotalSwitchingEnd = Abc_NtkMfsTotalSwitching(pNtk);
//        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }

    // free the manager
    p->timeTotal = Abc_Clock() - clk;
    Mfs_ManStop( p );
    return 1;
}